

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall
leveldb::DBImpl::WriteLevel0Table(DBImpl *this,MemTable *mem,VersionEdit *edit,Version *base)

{
  Logger *info_log;
  undefined1 uVar1;
  Iterator *pIVar2;
  char *pcVar3;
  long in_RSI;
  char *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar4;
  Slice SVar5;
  Slice SVar6;
  FileMetaData *in_stack_00000020;
  int level;
  Iterator *iter;
  uint64_t start_micros;
  Status *s;
  CompactionStats stats;
  Slice max_user_key;
  Slice min_user_key;
  FileMetaData meta;
  VersionSet *in_stack_fffffffffffffe38;
  FileMetaData *this_00;
  Status *in_stack_fffffffffffffe40;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffe48;
  MemTable *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe78;
  int level_00;
  Slice *largest_user_key;
  Slice *smallest_user_key;
  Version *this_01;
  Iterator *in_stack_ffffffffffffff30;
  TableCache *in_stack_ffffffffffffff38;
  Options *in_stack_ffffffffffffff40;
  Env *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  undefined1 local_98 [64];
  Slice *local_58;
  Slice *local_50;
  pointer local_8;
  
  local_8 = *(pointer *)(in_FS_OFFSET + 0x28);
  port::Mutex::AssertHeld((Mutex *)in_stack_fffffffffffffe38);
  (**(code **)(**(long **)(in_RSI + 8) + 0x98))();
  FileMetaData::FileMetaData((FileMetaData *)in_stack_fffffffffffffe58);
  local_58 = (Slice *)VersionSet::NewFileNumber(in_stack_fffffffffffffe38);
  pVar4 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                    (in_stack_fffffffffffffe48,(value_type_conflict *)in_stack_fffffffffffffe40);
  local_98._8_8_ = pVar4.first._M_node;
  local_98[0x10] = pVar4.second;
  pIVar2 = MemTable::NewIterator(in_stack_fffffffffffffe58);
  Log(*(Logger **)(in_RSI + 0x48),"Level-0 table #%llu: started",local_58);
  Status::Status((Status *)in_stack_fffffffffffffe38);
  port::Mutex::Unlock((Mutex *)in_stack_fffffffffffffe38);
  this_00 = (FileMetaData *)(local_98 + 0x38);
  BuildTable(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_00000020);
  this_01 = (Version *)local_98;
  Status::operator=((Status *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  Status::~Status((Status *)this_00);
  port::Mutex::Lock((Mutex *)this_00);
  info_log = *(Logger **)(in_RSI + 0x48);
  largest_user_key = local_58;
  smallest_user_key = local_50;
  Status::ToString_abi_cxx11_((Status *)local_50);
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  Log(info_log,"Level-0 table #%llu: %lld bytes %s",largest_user_key,smallest_user_key,pcVar3);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  if (pIVar2 != (Iterator *)0x0) {
    (*pIVar2->_vptr_Iterator[1])();
  }
  level_00 = (int)((ulong)pIVar2 >> 0x20);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
            (in_stack_fffffffffffffe48,(key_type *)in_stack_fffffffffffffe40);
  uVar1 = Status::ok((Status *)this_00);
  if (((bool)uVar1) && (local_50 != (Slice *)0x0)) {
    SVar5 = InternalKey::user_key((InternalKey *)in_stack_fffffffffffffe48);
    SVar6 = InternalKey::user_key((InternalKey *)in_stack_fffffffffffffe48);
    if (in_R8 != 0) {
      Version::PickLevelForMemTableOutput(this_01,smallest_user_key,largest_user_key);
    }
    VersionEdit::AddFile
              ((VersionEdit *)CONCAT17(uVar1,in_stack_fffffffffffffe78),level_00,
               (uint64_t)SVar5.data_,SVar5.size_,(InternalKey *)SVar6.data_,
               (InternalKey *)SVar6.size_);
  }
  CompactionStats::CompactionStats((CompactionStats *)this_00);
  (**(code **)(**(long **)(in_RSI + 8) + 0x98))();
  CompactionStats::Add((CompactionStats *)this_00,(CompactionStats *)0x188cc9a);
  FileMetaData::~FileMetaData(this_00);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status DBImpl::WriteLevel0Table(MemTable* mem, VersionEdit* edit,
                                Version* base) {
  mutex_.AssertHeld();
  const uint64_t start_micros = env_->NowMicros();
  FileMetaData meta;
  meta.number = versions_->NewFileNumber();
  pending_outputs_.insert(meta.number);
  Iterator* iter = mem->NewIterator();
  Log(options_.info_log, "Level-0 table #%llu: started",
      (unsigned long long)meta.number);

  Status s;
  {
    mutex_.Unlock();
    s = BuildTable(dbname_, env_, options_, table_cache_, iter, &meta);
    mutex_.Lock();
  }

  Log(options_.info_log, "Level-0 table #%llu: %lld bytes %s",
      (unsigned long long)meta.number, (unsigned long long)meta.file_size,
      s.ToString().c_str());
  delete iter;
  pending_outputs_.erase(meta.number);

  // Note that if file_size is zero, the file has been deleted and
  // should not be added to the manifest.
  int level = 0;
  if (s.ok() && meta.file_size > 0) {
    const Slice min_user_key = meta.smallest.user_key();
    const Slice max_user_key = meta.largest.user_key();
    if (base != nullptr) {
      level = base->PickLevelForMemTableOutput(min_user_key, max_user_key);
    }
    edit->AddFile(level, meta.number, meta.file_size, meta.smallest,
                  meta.largest);
  }

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros;
  stats.bytes_written = meta.file_size;
  stats_[level].Add(stats);
  return s;
}